

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_remove_window(nk_context *ctx,nk_window *win)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_window *pnVar3;
  nk_window *pnVar4;
  
  if (ctx->begin == win) {
    pnVar2 = win->next;
    ctx->begin = pnVar2;
    if (pnVar2 != (nk_window *)0x0) {
      pnVar2->prev = (nk_window *)0x0;
    }
LAB_0012b4db:
    pnVar2 = ctx->end;
    if (pnVar2 == win) {
      pnVar2 = win->prev;
      ctx->end = pnVar2;
      if (pnVar2 == (nk_window *)0x0) {
        if (ctx->active == win || ctx->active == (nk_window *)0x0) {
          ctx->active = (nk_window *)0x0;
        }
        goto LAB_0012b52d;
      }
      pnVar4 = (nk_window *)0x0;
      pnVar3 = pnVar2;
LAB_0012b4ff:
      pnVar3->next = pnVar4;
    }
  }
  else {
    pnVar2 = ctx->end;
    if (pnVar2 == win) goto LAB_0012b4db;
    pnVar4 = win->next;
    pnVar3 = win->prev;
    if (pnVar4 != (nk_window *)0x0) {
      pnVar4->prev = pnVar3;
    }
    if (pnVar3 != (nk_window *)0x0) goto LAB_0012b4ff;
  }
  if ((ctx->active == (nk_window *)0x0 || ctx->active == win) &&
     (ctx->active = pnVar2, pnVar2 != (nk_window *)0x0)) {
    pbVar1 = (byte *)((long)&pnVar2->flags + 1);
    *pbVar1 = *pbVar1 & 0xef;
  }
LAB_0012b52d:
  win->next = (nk_window *)0x0;
  win->prev = (nk_window *)0x0;
  ctx->count = ctx->count - 1;
  return;
}

Assistant:

NK_LIB void
nk_remove_window(struct nk_context *ctx, struct nk_window *win)
{
    if (win == ctx->begin || win == ctx->end) {
        if (win == ctx->begin) {
            ctx->begin = win->next;
            if (win->next)
                win->next->prev = 0;
        }
        if (win == ctx->end) {
            ctx->end = win->prev;
            if (win->prev)
                win->prev->next = 0;
        }
    } else {
        if (win->next)
            win->next->prev = win->prev;
        if (win->prev)
            win->prev->next = win->next;
    }
    if (win == ctx->active || !ctx->active) {
        ctx->active = ctx->end;
        if (ctx->end)
            ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    win->next = 0;
    win->prev = 0;
    ctx->count--;
}